

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

bool units::wordModifiers(string *unit)

{
  char *pcVar1;
  pointer pcVar2;
  size_type sVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  allocator local_51;
  long *local_50;
  string *local_48;
  long local_40 [2];
  
  iVar4 = std::__cxx11::string::compare((ulong)unit,0,(char *)0x3);
  if (iVar4 == 0) {
    return false;
  }
  iVar4 = std::__cxx11::string::compare((ulong)unit,0,(char *)0xd);
  if (iVar4 == 0) {
    return false;
  }
  lVar6 = 0x18;
  do {
    pcVar1 = *(char **)((long)&modifyTailCodes::trailTempCodeReplacements._M_elems[0xb].first +
                       lVar6);
    if (pcVar1 <= (char *)unit->_M_string_length) {
      switch(*(undefined4 *)
              ((long)&modifyTailCodes::trailTempCodeReplacements._M_elems[10].second + lVar6)) {
      case 0:
        iVar4 = std::__cxx11::string::compare((ulong)unit,0,pcVar1);
        if (iVar4 == 0) {
          if ((char *)unit->_M_string_length == pcVar1) goto LAB_0016a504;
          std::__cxx11::string::erase((ulong)unit,0);
LAB_0016a533:
          std::__cxx11::string::append((char *)unit);
          goto LAB_0016a540;
        }
        break;
      case 1:
        iVar4 = std::__cxx11::string::compare((ulong)unit,0,pcVar1);
        if (iVar4 == 0) {
          pcVar5 = *(char **)((long)&modifyTailCodes::trailTempCodeReplacements._M_elems[0xb].second
                             + lVar6);
          strlen(pcVar5);
          uVar7 = 0;
LAB_0016a4f4:
          std::__cxx11::string::replace((ulong)unit,uVar7,pcVar1,(ulong)pcVar5);
          goto LAB_0016a540;
        }
        break;
      case 2:
        pcVar5 = *(char **)((long)&wordModifiers::modifiers._M_elems[0].
                                   super__Tuple_impl<0UL,_const_char_*,_const_char_*,_unsigned_long,_units::modifier>
                                   .
                                   super__Tuple_impl<1UL,_const_char_*,_unsigned_long,_units::modifier>
                                   .super__Tuple_impl<2UL,_unsigned_long,_units::modifier>.
                                   super__Tuple_impl<3UL,_units::modifier>.
                                   super__Head_base<3UL,_units::modifier,_false>._M_head_impl +
                           lVar6);
        strlen(pcVar5);
        uVar7 = std::__cxx11::string::find((char *)unit,(ulong)pcVar5,0);
        if (uVar7 != 0xffffffffffffffff) {
          if (uVar7 == 0) {
            std::__cxx11::string::erase((ulong)unit,0);
            std::__cxx11::string::push_back((char)unit);
          }
          else {
            std::__cxx11::string::replace((ulong)unit,uVar7,pcVar1,0x17b422);
          }
          goto LAB_0016a533;
        }
        break;
      case 3:
        pcVar5 = *(char **)((long)&wordModifiers::modifiers._M_elems[0].
                                   super__Tuple_impl<0UL,_const_char_*,_const_char_*,_unsigned_long,_units::modifier>
                                   .
                                   super__Tuple_impl<1UL,_const_char_*,_unsigned_long,_units::modifier>
                                   .super__Tuple_impl<2UL,_unsigned_long,_units::modifier>.
                                   super__Tuple_impl<3UL,_units::modifier>.
                                   super__Head_base<3UL,_units::modifier,_false>._M_head_impl +
                           lVar6);
        strlen(pcVar5);
        uVar7 = std::__cxx11::string::find((char *)unit,(ulong)pcVar5,0);
        if (uVar7 != 0xffffffffffffffff) {
          if ((char *)unit->_M_string_length != pcVar1) {
            pcVar5 = *(char **)((long)&modifyTailCodes::trailTempCodeReplacements._M_elems[0xb].
                                       second + lVar6);
            strlen(pcVar5);
            goto LAB_0016a4f4;
          }
          goto LAB_0016a504;
        }
        break;
      case 4:
        std::__cxx11::string::string
                  ((string *)&local_50,
                   *(char **)((long)&wordModifiers::modifiers._M_elems[0].
                                     super__Tuple_impl<0UL,_const_char_*,_const_char_*,_unsigned_long,_units::modifier>
                                     .
                                     super__Tuple_impl<1UL,_const_char_*,_unsigned_long,_units::modifier>
                                     .super__Tuple_impl<2UL,_unsigned_long,_units::modifier>.
                                     super__Tuple_impl<3UL,_units::modifier>.
                                     super__Head_base<3UL,_units::modifier,_false>._M_head_impl +
                             lVar6),&local_51);
        uVar7 = (long)unit->_M_string_length - (long)local_48;
        if ((string *)unit->_M_string_length < local_48 || uVar7 == 0) {
          bVar8 = false;
        }
        else {
          iVar4 = std::__cxx11::string::compare((ulong)unit,uVar7,local_48);
          bVar8 = iVar4 == 0;
        }
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
        if (bVar8) {
          uVar7 = unit->_M_string_length - (long)pcVar1;
          pcVar5 = *(char **)((long)&modifyTailCodes::trailTempCodeReplacements._M_elems[0xb].second
                             + lVar6);
          strlen(pcVar5);
          goto LAB_0016a4f4;
        }
      }
    }
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0x4f8);
  pcVar2 = (unit->_M_dataplus)._M_p;
  sVar3 = unit->_M_string_length;
  if ((byte)(pcVar2[sVar3 - 1] - 0x30U) < 10) {
    if (pcVar2[sVar3 - 2] == '-') {
      lVar6 = sVar3 - 2;
    }
    else {
      if ((byte)(pcVar2[sVar3 - 2] - 0x30U) < 10) goto LAB_0016a504;
      lVar6 = sVar3 - 1;
    }
    std::__cxx11::string::_M_replace_aux((ulong)unit,(long)(pcVar2 + lVar6) - (long)pcVar2,0,'\x01')
    ;
LAB_0016a540:
    bVar8 = true;
  }
  else {
LAB_0016a504:
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

static bool wordModifiers(std::string& unit)
{
    static UNITS_CPP14_CONSTEXPR_OBJECT std::array<modSeq, 39> modifiers{{
        modSeq{"reciprocalsquare", "^-2", 16, modifier::start_tail},
        modSeq{"reciprocalcubic", "^-3", 15, modifier::start_tail},
        modSeq{"squaremeter", "m^2", 11, modifier::anywhere_tail},
        modSeq{"cubicmeter", "m^3", 10, modifier::anywhere_tail},
        modSeq{"cubic", "^3", 5, modifier::start_tail},
        modSeq{"reciprocal", "^-1", 10, modifier::start_tail},
        modSeq{"reciprocal", "^-1", 10, modifier::tail_replace},
        modSeq{"square", "^2", 6, modifier::start_tail},
        modSeq{"squared", "^2", 7, modifier::start_tail},
        modSeq{"cubed", "^2", 7, modifier::start_tail},
        modSeq{"cu", "^3", 2, modifier::start_tail},
        modSeq{"sq", "^2", 2, modifier::start_tail},
        modSeq{"tenthousand", "10000", 11, modifier::anywhere_replace},
        modSeq{"tenths", "0.1", 5, modifier::anywhere_replace},
        modSeq{"tenth", "0.1", 5, modifier::anywhere_replace},
        modSeq{"ten", "10", 3, modifier::anywhere_replace},
        modSeq{"one", "", 3, modifier::start_replace},
        modSeq{"quarter", "0.25", 7, modifier::anywhere_replace},
        modSeq{"eighth", "0.125", 6, modifier::anywhere_replace},
        modSeq{"sixteenth", "0.0625", 9, modifier::anywhere_replace},
        modSeq{"thirtyseconds", "0.03125", 13, modifier::anywhere_replace},
        modSeq{"sixtyfourths", "0.015625", 12, modifier::anywhere_replace},
        modSeq{"half", "0.5", 4, modifier::anywhere_replace},
        modSeq{"hundred", "100", 7, modifier::anywhere_replace},
        modSeq{"million", "1e6", 7, modifier::anywhere_replace},
        modSeq{"billion", "1e9", 7, modifier::anywhere_replace},
        modSeq{"trillion", "1e12", 8, modifier::anywhere_replace},
        modSeq{"thousand", "1000", 8, modifier::anywhere_replace},
        modSeq{"tothethirdpower", "^3", 15, modifier::anywhere_replace},
        modSeq{"tothefourthpower", "^4", 16, modifier::anywhere_replace},
        modSeq{"tothefifthpower", "^5", 15, modifier::anywhere_replace},
        modSeq{"tothesixthpower", "^6", 15, modifier::anywhere_replace},
        modSeq{"squared", "^2", 7, modifier::anywhere_replace},
        modSeq{"cubed", "^3", 5, modifier::anywhere_replace},
        modSeq{"square", "^2", 6, modifier::anywhere_tail},
        modSeq{"cubic", "^3", 5, modifier::anywhere_tail},
        modSeq{"sq", "^2", 2, modifier::tail_replace},
        modSeq{"cu", "^3", 2, modifier::tail_replace},
        modSeq{"u", "unit", 1, modifier::tail_replace},
    }};
    if (unit.compare(0, 3, "cup") ==
        0) {  // this causes too many issues so skip it
        return false;
    }
    if (unit.compare(0, 13, "hundredweight") ==
        0) {  // this is a specific unit and should not be cut off
        return false;
    }
    for (const auto& mod : modifiers) {
        if (unit.size() < std::get<2>(mod)) {
            continue;
        }
        switch (std::get<3>(mod)) {
            case modifier::tail_replace: {
                if (ends_with(unit, std::get<0>(mod))) {
                    unit.replace(
                        unit.size() - std::get<2>(mod),
                        std::get<2>(mod),
                        std::get<1>(mod));
                    return true;
                }
                break;
            }
            case modifier::anywhere_replace: {
                auto fnd = unit.find(std::get<0>(mod));
                if (fnd != std::string::npos) {
                    if (unit.size() == std::get<2>(mod)) {
                        return false;
                    }
                    unit.replace(fnd, std::get<2>(mod), std::get<1>(mod));
                    return true;
                }
                break;
            }
            case modifier::start_tail: {
                if (unit.compare(0, std::get<2>(mod), std::get<0>(mod)) == 0) {
                    if (unit.size() == std::get<2>(mod)) {
                        return false;
                    }
                    unit.erase(0, std::get<2>(mod));
                    unit.append(std::get<1>(mod));
                    return true;
                }
                break;
                case modifier::anywhere_tail: {
                    auto fnd = unit.find(std::get<0>(mod));
                    if (fnd != std::string::npos) {
                        // this will need to be added in again if more string
                        // are added to the search list with this type if
                        // (unit.size() == std::get<2>(mod))
                        //{
                        //    return false;
                        //}
                        if (fnd != 0) {
                            unit.replace(fnd, std::get<2>(mod), "*");
                        } else {
                            unit.erase(0, std::get<2>(mod));
                            unit.push_back('*');
                        }
                        unit.append(std::get<1>(mod));
                        return true;
                    }
                }
            } break;
            case modifier::start_replace: {
                if (unit.compare(0, std::get<2>(mod), std::get<0>(mod)) == 0) {
                    unit.replace(0, std::get<2>(mod), std::get<1>(mod));
                    return true;
                }
            } break;
        }
    }

    // deal with strings if the end is a number that didn't have a ^
    if (isDigitCharacter(unit.back())) {
        if (unit[unit.size() - 2] == '-') {
            unit.insert(unit.end() - 2, '^');
            return true;
        }
        if (!isDigitCharacter(unit[unit.size() - 2])) {
            unit.insert(unit.end() - 1, '^');
            return true;
        }
    }

    return false;
}